

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::dragLeaveEvent(QAbstractItemView *this,QDragLeaveEvent *param_2)

{
  QAbstractItemViewPrivate *pQVar1;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemViewPrivate *d;
  QAbstractItemView *in_stack_ffffffffffffffc0;
  QModelIndex *pQVar2;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QAbstractItemView *)0x806cce);
  stopAutoScroll((QAbstractItemView *)0x806cdc);
  setState(in_stack_ffffffffffffffc0,(State)((ulong)in_RDI >> 0x20));
  pQVar2 = (QModelIndex *)local_20;
  QModelIndex::QModelIndex((QModelIndex *)0x806cf6);
  QPersistentModelIndex::operator=(&pQVar1->hover,pQVar2);
  QWidget::update(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::dragLeaveEvent(QDragLeaveEvent *)
{
    Q_D(QAbstractItemView);
    stopAutoScroll();
    setState(NoState);
    d->hover = QModelIndex();
    d->viewport->update();
}